

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

LBBox3fa * __thiscall
embree::sse2::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,Vec3fa *ofs,float scale,
          float r_scale0,LinearSpace3fa *space,size_t primID,BBox1f *time_range)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  size_t *psVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar53 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar66;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  
  fVar50 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar36 = (this->super_LineSegments).super_Geometry.time_range.lower;
  fVar41 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar36;
  fVar49 = (time_range->lower - fVar36) / fVar41;
  fVar41 = (time_range->upper - fVar36) / fVar41;
  fVar36 = fVar50 * fVar49;
  fVar51 = fVar50 * fVar41;
  fVar37 = floorf(fVar36);
  fVar38 = ceilf(fVar51);
  iVar30 = (int)fVar37;
  if (fVar37 <= 0.0) {
    fVar37 = 0.0;
  }
  fVar43 = fVar38;
  if (fVar50 <= fVar38) {
    fVar43 = fVar50;
  }
  iVar28 = -1;
  if (-1 < iVar30) {
    iVar28 = iVar30;
  }
  uVar15 = (int)fVar50 + 1U;
  if ((int)fVar38 < (int)((int)fVar50 + 1U)) {
    uVar15 = (int)fVar38;
  }
  lVar32 = (long)(int)fVar37;
  uVar29 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                    primID * *(long *)&(this->super_LineSegments).field_0x68);
  uVar31 = (ulong)uVar29;
  pBVar5 = (this->super_LineSegments).vertices.items;
  pcVar6 = pBVar5[lVar32].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[lVar32].super_RawBufferView.stride;
  pfVar1 = (float *)(pcVar6 + sVar7 * uVar31);
  uVar33 = (ulong)(uVar29 + 1);
  pfVar2 = (float *)(pcVar6 + sVar7 * uVar33);
  fVar16 = (ofs->field_0).m128[0];
  fVar17 = (ofs->field_0).m128[1];
  fVar18 = (ofs->field_0).m128[2];
  fVar42 = (*pfVar1 - fVar16) * scale;
  fVar44 = (pfVar1[1] - fVar17) * scale;
  fVar46 = (pfVar1[2] - fVar18) * scale;
  fVar19 = (space->vx).field_0.m128[0];
  fVar20 = (space->vx).field_0.m128[1];
  fVar21 = (space->vx).field_0.m128[2];
  fVar22 = (space->vy).field_0.m128[0];
  fVar23 = (space->vy).field_0.m128[1];
  fVar24 = (space->vy).field_0.m128[2];
  fVar25 = (space->vz).field_0.m128[0];
  fVar26 = (space->vz).field_0.m128[1];
  fVar27 = (space->vz).field_0.m128[2];
  auVar70._8_4_ = fVar42 * fVar21 + fVar44 * fVar24 + fVar46 * fVar27;
  fVar38 = (*pfVar2 - fVar16) * scale;
  fVar54 = (pfVar2[1] - fVar17) * scale;
  fVar56 = (pfVar2[2] - fVar18) * scale;
  fVar76 = fVar38 * fVar19 + fVar54 * fVar22 + fVar56 * fVar25;
  fVar78 = fVar38 * fVar20 + fVar54 * fVar23 + fVar56 * fVar26;
  fVar80 = fVar38 * fVar21 + fVar54 * fVar24 + fVar56 * fVar27;
  lVar35 = (long)(int)fVar43;
  pcVar6 = pBVar5[lVar35].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[lVar35].super_RawBufferView.stride;
  pfVar3 = (float *)(pcVar6 + sVar7 * uVar31);
  fVar54 = (*pfVar3 - fVar16) * scale;
  fVar56 = (pfVar3[1] - fVar17) * scale;
  fVar47 = (pfVar3[2] - fVar18) * scale;
  pfVar4 = (float *)(pcVar6 + sVar7 * uVar33);
  auVar53._8_4_ = fVar54 * fVar21 + fVar56 * fVar24 + fVar47 * fVar27;
  fVar38 = (*pfVar4 - fVar16) * scale;
  fVar45 = (pfVar4[1] - fVar17) * scale;
  fVar48 = (pfVar4[2] - fVar18) * scale;
  auVar63._0_4_ = fVar38 * fVar19 + fVar45 * fVar22 + fVar48 * fVar25;
  auVar63._4_4_ = fVar38 * fVar20 + fVar45 * fVar23 + fVar48 * fVar26;
  auVar63._8_4_ = fVar38 * fVar21 + fVar45 * fVar24 + fVar48 * fVar27;
  fVar38 = (this->super_LineSegments).maxRadiusScale;
  fVar61 = r_scale0 * scale;
  fVar45 = pfVar1[3] * fVar38 * fVar61;
  fVar48 = pfVar2[3] * fVar38 * fVar61;
  auVar70._0_8_ =
       CONCAT44(fVar42 * fVar20 + fVar44 * fVar23 + fVar46 * fVar26,
                fVar42 * fVar19 + fVar44 * fVar22 + fVar46 * fVar25);
  auVar70._12_4_ = fVar45;
  fVar42 = fVar48;
  if (fVar48 <= fVar45) {
    fVar42 = fVar45;
  }
  auVar39._8_4_ = auVar70._8_4_;
  auVar39._0_8_ = auVar70._0_8_;
  auVar39._12_4_ = fVar45;
  auVar40._4_4_ = fVar78;
  auVar40._0_4_ = fVar76;
  auVar40._8_4_ = fVar80;
  auVar40._12_4_ = fVar48;
  auVar40 = minps(auVar39,auVar40);
  auVar14._4_4_ = fVar78;
  auVar14._0_4_ = fVar76;
  auVar14._8_4_ = fVar80;
  auVar14._12_4_ = fVar48;
  auVar70 = maxps(auVar70,auVar14);
  fVar42 = fVar42 * fVar38;
  fVar44 = auVar40._0_4_ - fVar42;
  fVar45 = auVar40._4_4_ - fVar42;
  fVar46 = auVar40._8_4_ - fVar42;
  fVar48 = auVar40._12_4_ - fVar42;
  fVar80 = fVar42 + auVar70._0_4_;
  fVar74 = fVar42 + auVar70._4_4_;
  fVar75 = fVar42 + auVar70._8_4_;
  fVar42 = fVar42 + auVar70._12_4_;
  fVar76 = pfVar3[3] * fVar38 * fVar61;
  fVar78 = pfVar4[3] * fVar38 * fVar61;
  auVar53._0_8_ =
       CONCAT44(fVar54 * fVar20 + fVar56 * fVar23 + fVar47 * fVar26,
                fVar54 * fVar19 + fVar56 * fVar22 + fVar47 * fVar25);
  auVar53._12_4_ = fVar76;
  fVar54 = fVar78;
  if (fVar78 <= fVar76) {
    fVar54 = fVar76;
  }
  auVar63._12_4_ = fVar78;
  auVar71._8_4_ = auVar53._8_4_;
  auVar71._0_8_ = auVar53._0_8_;
  auVar71._12_4_ = fVar76;
  auVar70 = minps(auVar71,auVar63);
  auVar53 = maxps(auVar53,auVar63);
  fVar54 = fVar54 * fVar38;
  fVar56 = auVar70._0_4_ - fVar54;
  fVar47 = auVar70._4_4_ - fVar54;
  fVar76 = auVar70._8_4_ - fVar54;
  fVar78 = auVar70._12_4_ - fVar54;
  fVar77 = fVar54 + auVar53._0_4_;
  fVar79 = fVar54 + auVar53._4_4_;
  fVar81 = fVar54 + auVar53._8_4_;
  fVar54 = fVar54 + auVar53._12_4_;
  if (uVar15 - iVar28 == 1) {
    fVar36 = fVar36 - fVar37;
    if (fVar36 <= 0.0) {
      fVar36 = 0.0;
    }
    fVar50 = 1.0 - fVar36;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar50 * fVar44 + fVar36 * fVar56;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar50 * fVar45 + fVar36 * fVar47;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar50 * fVar46 + fVar36 * fVar76;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar50 * fVar48 + fVar36 * fVar78;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar50 * fVar80 + fVar36 * fVar77;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar50 * fVar74 + fVar36 * fVar79;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar50 * fVar75 + fVar36 * fVar81;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar50 * fVar42 + fVar36 * fVar54;
    fVar43 = fVar43 - fVar51;
    if (fVar43 <= 0.0) {
      fVar43 = 0.0;
    }
    fVar50 = 1.0 - fVar43;
    fVar69 = fVar56 * fVar50 + fVar44 * fVar43;
    fVar72 = fVar47 * fVar50 + fVar45 * fVar43;
    fVar73 = fVar76 * fVar50 + fVar46 * fVar43;
    fVar78 = fVar78 * fVar50 + fVar48 * fVar43;
    fVar56 = fVar50 * fVar77 + fVar43 * fVar80;
    fVar47 = fVar50 * fVar79 + fVar43 * fVar74;
    fVar76 = fVar50 * fVar81 + fVar43 * fVar75;
    fVar51 = fVar50 * fVar54 + fVar43 * fVar42;
  }
  else {
    pcVar6 = pBVar5[lVar32 + 1].super_RawBufferView.ptr_ofs;
    sVar7 = pBVar5[lVar32 + 1].super_RawBufferView.stride;
    pfVar1 = (float *)(pcVar6 + sVar7 * uVar31);
    pfVar2 = (float *)(pcVar6 + sVar7 * uVar33);
    fVar69 = (*pfVar1 - fVar16) * scale;
    fVar55 = (pfVar1[1] - fVar17) * scale;
    fVar57 = (pfVar1[2] - fVar18) * scale;
    auVar67._8_4_ = fVar69 * fVar21 + fVar55 * fVar24 + fVar57 * fVar27;
    fVar73 = (*pfVar2 - fVar16) * scale;
    fVar58 = (pfVar2[1] - fVar17) * scale;
    fVar59 = (pfVar2[2] - fVar18) * scale;
    fVar52 = fVar73 * fVar19 + fVar58 * fVar22 + fVar59 * fVar25;
    fVar72 = fVar73 * fVar20 + fVar58 * fVar23 + fVar59 * fVar26;
    fVar73 = fVar73 * fVar21 + fVar58 * fVar24 + fVar59 * fVar27;
    fVar58 = pfVar1[3] * fVar38 * fVar61;
    fVar59 = pfVar2[3] * fVar38 * fVar61;
    auVar67._0_8_ =
         CONCAT44(fVar69 * fVar20 + fVar55 * fVar23 + fVar57 * fVar26,
                  fVar69 * fVar19 + fVar55 * fVar22 + fVar57 * fVar25);
    auVar67._12_4_ = fVar58;
    fVar69 = fVar59;
    if (fVar59 <= fVar58) {
      fVar69 = fVar58;
    }
    auVar83._8_4_ = auVar67._8_4_;
    auVar83._0_8_ = auVar67._0_8_;
    auVar83._12_4_ = fVar58;
    auVar8._4_4_ = fVar72;
    auVar8._0_4_ = fVar52;
    auVar8._8_4_ = fVar73;
    auVar8._12_4_ = fVar59;
    auVar70 = minps(auVar83,auVar8);
    auVar9._4_4_ = fVar72;
    auVar9._0_4_ = fVar52;
    auVar9._8_4_ = fVar73;
    auVar9._12_4_ = fVar59;
    auVar53 = maxps(auVar67,auVar9);
    fVar69 = fVar69 * fVar38;
    pcVar6 = pBVar5[lVar35 + -1].super_RawBufferView.ptr_ofs;
    sVar7 = pBVar5[lVar35 + -1].super_RawBufferView.stride;
    pfVar1 = (float *)(pcVar6 + sVar7 * uVar31);
    pfVar2 = (float *)(pcVar6 + sVar7 * uVar33);
    fVar55 = (*pfVar1 - fVar16) * scale;
    fVar58 = (pfVar1[1] - fVar17) * scale;
    fVar60 = (pfVar1[2] - fVar18) * scale;
    auVar82._8_4_ = fVar55 * fVar21 + fVar58 * fVar24 + fVar60 * fVar27;
    fVar52 = (*pfVar2 - fVar16) * scale;
    fVar72 = (pfVar2[1] - fVar17) * scale;
    fVar73 = (pfVar2[2] - fVar18) * scale;
    fVar57 = fVar52 * fVar19 + fVar72 * fVar22 + fVar73 * fVar25;
    fVar59 = fVar52 * fVar20 + fVar72 * fVar23 + fVar73 * fVar26;
    fVar72 = fVar52 * fVar21 + fVar72 * fVar24 + fVar73 * fVar27;
    fVar73 = pfVar1[3] * fVar38 * fVar61;
    fVar66 = pfVar2[3] * fVar38 * fVar61;
    auVar82._0_8_ =
         CONCAT44(fVar55 * fVar20 + fVar58 * fVar23 + fVar60 * fVar26,
                  fVar55 * fVar19 + fVar58 * fVar22 + fVar60 * fVar25);
    auVar82._12_4_ = fVar73;
    fVar52 = fVar66;
    if (fVar66 <= fVar73) {
      fVar52 = fVar73;
    }
    auVar62._8_4_ = auVar82._8_4_;
    auVar62._0_8_ = auVar82._0_8_;
    auVar62._12_4_ = fVar73;
    auVar10._4_4_ = fVar59;
    auVar10._0_4_ = fVar57;
    auVar10._8_4_ = fVar72;
    auVar10._12_4_ = fVar66;
    auVar63 = minps(auVar62,auVar10);
    auVar11._4_4_ = fVar59;
    auVar11._0_4_ = fVar57;
    auVar11._8_4_ = fVar72;
    auVar11._12_4_ = fVar66;
    auVar40 = maxps(auVar82,auVar11);
    fVar52 = fVar52 * fVar38;
    fVar36 = fVar36 - fVar37;
    if (fVar36 <= 0.0) {
      fVar36 = 0.0;
    }
    fVar72 = 1.0 - fVar36;
    fVar37 = fVar44 * fVar72 + (auVar70._0_4_ - fVar69) * fVar36;
    fVar44 = fVar45 * fVar72 + (auVar70._4_4_ - fVar69) * fVar36;
    fVar45 = fVar46 * fVar72 + (auVar70._8_4_ - fVar69) * fVar36;
    fVar46 = fVar48 * fVar72 + (auVar70._12_4_ - fVar69) * fVar36;
    fVar48 = fVar72 * fVar80 + fVar36 * (fVar69 + auVar53._0_4_);
    fVar80 = fVar72 * fVar74 + fVar36 * (fVar69 + auVar53._4_4_);
    fVar74 = fVar72 * fVar75 + fVar36 * (fVar69 + auVar53._8_4_);
    fVar36 = fVar72 * fVar42 + fVar36 * (fVar69 + auVar53._12_4_);
    fVar43 = fVar43 - fVar51;
    if (fVar43 <= 0.0) {
      fVar43 = 0.0;
    }
    fVar51 = 1.0 - fVar43;
    fVar69 = fVar56 * fVar51 + (auVar63._0_4_ - fVar52) * fVar43;
    fVar72 = fVar47 * fVar51 + (auVar63._4_4_ - fVar52) * fVar43;
    fVar73 = fVar76 * fVar51 + (auVar63._8_4_ - fVar52) * fVar43;
    fVar78 = fVar78 * fVar51 + (auVar63._12_4_ - fVar52) * fVar43;
    fVar56 = fVar51 * fVar77 + fVar43 * (fVar52 + auVar40._0_4_);
    fVar47 = fVar51 * fVar79 + fVar43 * (fVar52 + auVar40._4_4_);
    fVar76 = fVar51 * fVar81 + fVar43 * (fVar52 + auVar40._8_4_);
    fVar51 = fVar51 * fVar54 + fVar43 * (fVar52 + auVar40._12_4_);
    uVar29 = iVar28 + 1;
    if ((int)uVar29 < (int)uVar15) {
      psVar34 = &pBVar5[uVar29].super_RawBufferView.stride;
      do {
        pfVar1 = (float *)(((RawBufferView *)(psVar34 + -2))->ptr_ofs + *psVar34 * uVar31);
        pfVar2 = (float *)(((RawBufferView *)(psVar34 + -2))->ptr_ofs + *psVar34 * uVar33);
        fVar55 = ((float)(int)uVar29 / fVar50 - fVar49) / (fVar41 - fVar49);
        fVar43 = (*pfVar1 - fVar16) * scale;
        fVar54 = (pfVar1[1] - fVar17) * scale;
        fVar77 = (pfVar1[2] - fVar18) * scale;
        fVar79 = (*pfVar2 - fVar16) * scale;
        fVar81 = (pfVar2[1] - fVar17) * scale;
        fVar52 = (pfVar2[2] - fVar18) * scale;
        auVar68._8_4_ = fVar43 * fVar21 + fVar54 * fVar24 + fVar77 * fVar27;
        fVar57 = 1.0 - fVar55;
        fVar42 = fVar79 * fVar19 + fVar81 * fVar22 + fVar52 * fVar25;
        fVar75 = fVar79 * fVar20 + fVar81 * fVar23 + fVar52 * fVar26;
        fVar79 = fVar79 * fVar21 + fVar81 * fVar24 + fVar52 * fVar27;
        fVar81 = pfVar1[3] * fVar38 * fVar61;
        fVar52 = pfVar2[3] * fVar38 * fVar61;
        auVar68._0_8_ =
             CONCAT44(fVar43 * fVar20 + fVar54 * fVar23 + fVar77 * fVar26,
                      fVar43 * fVar19 + fVar54 * fVar22 + fVar77 * fVar25);
        auVar68._12_4_ = fVar81;
        fVar43 = fVar52;
        if (fVar52 <= fVar81) {
          fVar43 = fVar81;
        }
        auVar64._8_4_ = auVar68._8_4_;
        auVar64._0_8_ = auVar68._0_8_;
        auVar64._12_4_ = fVar81;
        auVar12._4_4_ = fVar75;
        auVar12._0_4_ = fVar42;
        auVar12._8_4_ = fVar79;
        auVar12._12_4_ = fVar52;
        auVar53 = minps(auVar64,auVar12);
        auVar13._4_4_ = fVar75;
        auVar13._0_4_ = fVar42;
        auVar13._8_4_ = fVar79;
        auVar13._12_4_ = fVar52;
        auVar70 = maxps(auVar68,auVar13);
        fVar43 = fVar43 * fVar38;
        auVar65._0_4_ = (auVar53._0_4_ - fVar43) - (fVar37 * fVar57 + fVar69 * fVar55);
        auVar65._4_4_ = (auVar53._4_4_ - fVar43) - (fVar44 * fVar57 + fVar72 * fVar55);
        auVar65._8_4_ = (auVar53._8_4_ - fVar43) - (fVar45 * fVar57 + fVar73 * fVar55);
        auVar65._12_4_ = (auVar53._12_4_ - fVar43) - (fVar46 * fVar57 + fVar78 * fVar55);
        auVar84._0_4_ = (fVar43 + auVar70._0_4_) - (fVar57 * fVar48 + fVar55 * fVar56);
        auVar84._4_4_ = (fVar43 + auVar70._4_4_) - (fVar57 * fVar80 + fVar55 * fVar47);
        auVar84._8_4_ = (fVar43 + auVar70._8_4_) - (fVar57 * fVar74 + fVar55 * fVar76);
        auVar84._12_4_ = (fVar43 + auVar70._12_4_) - (fVar57 * fVar36 + fVar55 * fVar51);
        auVar53 = minps(auVar65,ZEXT816(0));
        auVar70 = maxps(auVar84,ZEXT816(0));
        fVar37 = fVar37 + auVar53._0_4_;
        fVar44 = fVar44 + auVar53._4_4_;
        fVar45 = fVar45 + auVar53._8_4_;
        fVar46 = fVar46 + auVar53._12_4_;
        fVar69 = auVar53._0_4_ + fVar69;
        fVar72 = auVar53._4_4_ + fVar72;
        fVar73 = auVar53._8_4_ + fVar73;
        fVar78 = auVar53._12_4_ + fVar78;
        fVar48 = fVar48 + auVar70._0_4_;
        fVar80 = fVar80 + auVar70._4_4_;
        fVar74 = fVar74 + auVar70._8_4_;
        fVar36 = fVar36 + auVar70._12_4_;
        fVar56 = auVar70._0_4_ + fVar56;
        fVar47 = auVar70._4_4_ + fVar47;
        fVar76 = auVar70._8_4_ + fVar76;
        fVar51 = auVar70._12_4_ + fVar51;
        uVar29 = uVar29 + 1;
        psVar34 = psVar34 + 7;
      } while (uVar15 != uVar29);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar37;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar44;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar45;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar46;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar48;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar80;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar74;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar36;
  }
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar69;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar72;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar73;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar78;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar56;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar47;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar76;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar51;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const {
        return linearBounds(ofs,scale,r_scale0,space,primID,time_range);
      }